

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O3

void thin_up_box(int x,int y,int w,int h,Fl_Color c)

{
  if (4 < h && 4 < w) {
    shade_rect(x + 1,y + 1,w + -2,h + -3,"RQOQSUWQ",c);
    frame_rect(x,y,w,h + -1,"IJLM",c);
    return;
  }
  narrow_thin_box(x,y,w,h,c);
  return;
}

Assistant:

static void thin_up_box(int x, int y, int w, int h, Fl_Color c) {
#ifdef USE_OLD_PLASTIC_BOX
  shade_rect(x + 2, y + 2, w - 4, h - 5, "RVQNOPQRSTUVWVQ", c);
  up_frame(x, y, w, h, c);
#else
  if (w > 4 && h > 4) {
    shade_rect(x + 1, y + 1, w - 2, h - 3, "RQOQSUWQ", c);
    frame_rect(x, y, w, h - 1, "IJLM", c);
  } else {
    narrow_thin_box(x, y, w, h, c);
  }
#endif // USE_OLD_PLASTIC_BOX
}